

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseFuncModuleField(WastParser *this,Module *module)

{
  BindingHash *bindings;
  undefined8 uVar1;
  FuncModuleField *pFVar2;
  _Head_base<0UL,_wabt::Import_*,_false> _Var3;
  bool bVar4;
  Result RVar5;
  _Head_base<0UL,_wabt::Import_*,_false> _Var6;
  long lVar7;
  Enum EVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 auStack_138 [8];
  Location loc;
  ModuleFieldList export_fields;
  undefined1 auStack_f8 [8];
  TypeVector local_types;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  string local_b8 [16];
  undefined1 local_a8 [24];
  undefined1 local_90 [8];
  string name;
  FuncModuleField *local_68;
  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> field;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_50;
  _Head_base<0UL,_wabt::FuncModuleField_*,_false> local_48;
  allocator_type local_39;
  _Head_base<0UL,_wabt::Import_*,_false> local_38;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> import;
  
  RVar5 = Expect(this,Lpar);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)auStack_f8,this);
  loc.filename.size_ =
       (size_type)
       local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  auStack_138 = auStack_f8;
  loc.filename.data_ =
       (char *)local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
  Token::~Token((Token *)auStack_f8);
  RVar5 = Expect(this,Func);
  EVar8 = Error;
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  local_90 = (undefined1  [8])&name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  ParseBindVarOpt(this,(string *)local_90);
  loc.field_1._8_8_ = 0;
  RVar5 = ParseInlineExports(this,(ModuleFieldList *)((long)&loc.field_1 + 8),First);
  if (RVar5.enum_ == Error) goto LAB_00f6fe73;
  bVar4 = PeekMatchLpar(this,Import);
  if (bVar4) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::FuncImport,std::__cxx11::string&>
              ((wabt *)&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    _Var3._M_head_impl = local_38._M_head_impl;
    RVar5 = ParseInlineImport(this,local_38._M_head_impl);
    _Var6._M_head_impl = local_38._M_head_impl;
    if (((RVar5.enum_ != Error) &&
        (RVar5 = ParseTypeUseOpt(this,(FuncDeclaration *)
                                      &(((Func *)((long)_Var3._M_head_impl + 0x40))->decl).type_var.
                                       loc.filename.size_),
        _Var6._M_head_impl = local_38._M_head_impl, RVar5.enum_ != Error)) &&
       (RVar5 = ParseFuncSignature(this,(FuncSignature *)
                                        &(((Func *)((long)_Var3._M_head_impl + 0x40))->decl).sig.
                                         param_types.
                                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (BindingHash *)
                                   &(((Func *)((long)_Var3._M_head_impl + 0x40))->bindings).
                                    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                                    ._M_h._M_before_begin),
       _Var6._M_head_impl = local_38._M_head_impl, RVar5.enum_ != Error)) {
      auStack_f8 = (undefined1  [8])
                   &local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_construct<char_const*>((string *)auStack_f8,"type","");
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"param","");
      local_b8._0_8_ = local_a8;
      std::__cxx11::string::_M_construct<char_const*>(local_b8,"result","");
      __l._M_len = 3;
      __l._M_array = (iterator)auStack_f8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffff98,__l,&local_39);
      name.field_2._12_4_ =
           ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&stack0xffffffffffffff98,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff98);
      lVar7 = 0;
      do {
        if (local_a8 + lVar7 != *(undefined1 **)(local_b8 + lVar7)) {
          operator_delete(*(undefined1 **)(local_b8 + lVar7));
        }
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != -0x60);
      _Var6._M_head_impl = local_38._M_head_impl;
      if (name.field_2._12_4_ != 1) {
        GetLocation((Location *)auStack_f8,this);
        local_50._M_head_impl = (ImportModuleField *)operator_new(0x48);
        _Var6._M_head_impl = local_38._M_head_impl;
        local_38._M_head_impl = (Import *)0x0;
        ((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
        ((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
        ((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__ModuleField_0155b078;
        ((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.loc.filename.data_ = (char *)auStack_f8;
        ((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.loc.filename.size_ =
             (size_type)
             local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
        ((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.loc.field_1.field_1.offset =
             (size_t)local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                     .super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                 super_ModuleField.loc.field_1 + 8) =
             local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        ((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.type_ = Import;
        ((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_0155b118;
        ((local_50._M_head_impl)->import)._M_t.
        super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
        super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
        super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = _Var6._M_head_impl;
        Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                    *)&local_50);
        if (local_50._M_head_impl != (ImportModuleField *)0x0) {
          (*((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
            super_ModuleField._vptr_ModuleField[1])();
        }
        local_50._M_head_impl = (ImportModuleField *)0x0;
        _Var6._M_head_impl = local_38._M_head_impl;
LAB_00f7002a:
        if ((FuncModuleField *)_Var6._M_head_impl != (FuncModuleField *)0x0) {
          (*(((FuncModuleField *)_Var6._M_head_impl)->
            super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField._vptr_ModuleField[1]
          )();
        }
        anon_unknown_1::AppendInlineExportFields
                  (module,(ModuleFieldList *)((long)&loc.field_1 + 8),
                   (int)((ulong)((long)(module->funcs).
                                       super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->funcs).
                                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
        RVar5 = Expect(this,Rpar);
        EVar8 = (Enum)(RVar5.enum_ == Error);
        goto LAB_00f6fe73;
      }
    }
joined_r0x00f6ff3c:
    if ((FuncModuleField *)_Var6._M_head_impl != (FuncModuleField *)0x0) {
      (*(_Var6._M_head_impl)->_vptr_Import[1])();
    }
  }
  else {
    MakeUnique<wabt::FuncModuleField,wabt::Location&,std::__cxx11::string&>
              ((wabt *)&stack0xffffffffffffff98,(Location *)auStack_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    pFVar2 = local_68;
    RVar5 = ParseTypeUseOpt(this,&(local_68->func).decl);
    if (RVar5.enum_ != Error) {
      bindings = &(pFVar2->func).bindings;
      RVar5 = ParseFuncSignature(this,&(pFVar2->func).decl.sig,bindings);
      if (RVar5.enum_ != Error) {
        auStack_f8 = (undefined1  [8])0x0;
        local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        RVar5 = ParseBoundValueTypeList
                          (this,Local,(TypeVector *)auStack_f8,bindings,
                           (Index)((ulong)((long)(pFVar2->func).decl.sig.param_types.
                                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pFVar2->func).decl.sig.param_types.
                                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 2));
        if (RVar5.enum_ != Error) {
          LocalTypes::Set(&(pFVar2->func).local_types,(TypeVector *)auStack_f8);
          RVar5 = ParseTerminatingInstrList(this,&(pFVar2->func).exprs);
          if (RVar5.enum_ != Error) {
            local_48._M_head_impl = local_68;
            local_68 = (FuncModuleField *)0x0;
            Module::AppendField(module,(unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                                        *)&local_48);
            if (local_48._M_head_impl != (FuncModuleField *)0x0) {
              (*((local_48._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_48._M_head_impl = (FuncModuleField *)0x0;
            _Var6._M_head_impl = (Import *)local_68;
            if (auStack_f8 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_f8);
              _Var6._M_head_impl = (Import *)local_68;
            }
            goto LAB_00f7002a;
          }
        }
        _Var6._M_head_impl = (Import *)local_68;
        if (auStack_f8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_f8);
          _Var6._M_head_impl = (Import *)local_68;
        }
        goto joined_r0x00f6ff3c;
      }
    }
    if (local_68 != (FuncModuleField *)0x0) {
      (*(local_68->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.
        _vptr_ModuleField[1])();
    }
  }
LAB_00f6fe73:
  uVar1 = loc.field_1._8_8_;
  while ((long *)uVar1 != (long *)0x0) {
    lVar7 = *(long *)uVar1;
    uVar1 = *(long *)(uVar1 + 8);
    (**(code **)(lVar7 + 8))();
  }
  if (local_90 != (undefined1  [8])&name._M_string_length) {
    operator_delete((void *)local_90);
  }
  return (Result)EVar8;
}

Assistant:

Result WastParser::ParseFuncModuleField(Module* module) {
  WABT_TRACE(ParseFuncModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Func);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Func));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<FuncImport>(name);
    Func& func = import->func;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<FuncModuleField>(loc, name);
    Func& func = field->func;
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    TypeVector local_types;
    CHECK_RESULT(ParseBoundValueTypeList(TokenType::Local, &local_types,
                                         &func.bindings, func.GetNumParams()));
    func.local_types.Set(local_types);
    CHECK_RESULT(ParseTerminatingInstrList(&func.exprs));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->funcs.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}